

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error-formatter.cc
# Opt level: O3

void wabt::FormatErrorsToFile
               (Errors *errors,Type location_type,LexerSourceLineFinder *line_finder,FILE *file,
               string *header,PrintHeader print_header,int source_line_max_length)

{
  undefined1 local_70 [8];
  string s;
  Color color;
  
  Color::Color((Color *)((long)&s.field_2 + 8),file,true);
  FormatErrorsToString
            ((string *)local_70,errors,location_type,line_finder,(Color *)((long)&s.field_2 + 8),
             header,print_header,source_line_max_length);
  fwrite((void *)local_70,1,(size_t)s._M_dataplus._M_p,(FILE *)file);
  if (local_70 != (undefined1  [8])&s._M_string_length) {
    operator_delete((void *)local_70);
  }
  return;
}

Assistant:

void FormatErrorsToFile(const Errors& errors,
                        Location::Type location_type,
                        LexerSourceLineFinder* line_finder,
                        FILE* file,
                        const std::string& header,
                        PrintHeader print_header,
                        int source_line_max_length) {
  Color color(file);
  std::string s =
      FormatErrorsToString(errors, location_type, line_finder, color, header,
                           print_header, source_line_max_length);
  fwrite(s.data(), 1, s.size(), file);
}